

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall
Jinx::Impl::Parser::ParsePropertyDeclaration(Parser *this,VisibilityType scope,bool readOnly)

{
  pointer pSVar1;
  pointer pbVar2;
  Symbol *pSVar3;
  element_type *peVar4;
  bool bVar5;
  mapped_type *this_00;
  char *pcVar6;
  pointer __str;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  LibraryIPtr propertyLibrary;
  PropertyName propertyName;
  String name;
  String libraryName;
  Variant local_58;
  
  if (this->m_error != false) {
    return;
  }
  pSVar1 = (this->m_currentSymbol)._M_current;
  if (pSVar1 == (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    pcVar6 = "Unexpected end of script when parsing property declaration";
LAB_0011db9d:
    Error<>(this,pcVar6);
    return;
  }
  if (pSVar1->type != NameValue) {
    pcVar6 = "Unexpected symbol type when parsing property declaration";
    goto LAB_0011db9d;
  }
  pbVar2 = (this->m_importList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__str = (this->m_importList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_start; __str != pbVar2; __str = __str + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&propertyName,
               __str);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                            &propertyName,&((this->m_currentSymbol)._M_current)->text);
    if (bVar5) {
      Error<>(this,"Property name cannot start with an import library name");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                    &propertyName);
      return;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&propertyName);
  }
  std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&propertyLibrary.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>,
             &(this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>)
  ;
  CheckLibraryName_abi_cxx11_(&libraryName,this);
  if (libraryName._M_string_length != 0) {
    Runtime::GetLibraryInternal
              ((Runtime *)&propertyName,
               (String *)
               (this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&propertyLibrary.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> *)&propertyName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&propertyName.m_visibility);
    pSVar3 = (this->m_currentSymbol)._M_current;
    this->m_lastLine = pSVar3->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar3 + 1;
  }
  bVar5 = CheckName(this);
  if (!bVar5) {
    Error<>(this,"Property name expected");
    goto LAB_0011dddf;
  }
  propertyName.m_id._0_4_ = 0x3f;
  symbols._M_len = 1;
  symbols._M_array = (iterator)&propertyName;
  ParseMultiName_abi_cxx11_(&name,this,symbols);
  bVar5 = Library::PropertyNameExists
                    (propertyLibrary.
                     super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &name);
  peVar4 = propertyLibrary.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (bVar5) {
    pSVar1 = (this->m_currentSymbol)._M_current;
    if ((this->m_symbolList->
        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
        super__Vector_impl_data._M_start < pSVar1) {
      (this->m_currentSymbol)._M_current = pSVar1 + -1;
    }
    Error<>(this,"Property is already defined");
  }
  else {
    local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
    Variant::SetNull(&local_58);
    PropertyName::PropertyName(&propertyName,scope,readOnly,&peVar4->m_name,&name,&local_58);
    Variant::~Variant(&local_58);
    bVar5 = Library::RegisterPropertyName
                      (propertyLibrary.
                       super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &propertyName,true);
    if (bVar5) {
      EmitOpcode(this,Property);
      PropertyName::Write(&propertyName,&this->m_writer);
      bVar5 = Accept(this,To);
      if (bVar5) {
        ParseExpression(this);
        Expect(this,NewLine,"Error parsing expression");
        EmitOpcode(this,SetProp);
        BinaryWriter::Write(&this->m_writer,
                            CONCAT44(propertyName.m_id._4_4_,(undefined4)propertyName.m_id));
        local_58._0_8_ = CONCAT44(propertyName.m_id._4_4_,(undefined4)propertyName.m_id);
        this_00 = std::
                  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                  ::operator[](&this->m_idNameMap,(key_type *)&local_58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
                  (this_00,&propertyName.m_name);
      }
      else {
        if (readOnly) {
          pcVar6 = "Must assign property an initial value";
          goto LAB_0011ddc3;
        }
        Expect(this,NewLine,"Error declaring property");
      }
    }
    else {
      pcVar6 = "Error registering property name.  Possible duplicate.";
LAB_0011ddc3:
      Error<>(this,pcVar6);
    }
    PropertyName::~PropertyName(&propertyName);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&name);
LAB_0011dddf:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&libraryName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&propertyLibrary.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

inline_t void Parser::ParsePropertyDeclaration(VisibilityType scope, bool readOnly)
	{
		if (m_error)
			return;

		if (m_currentSymbol == m_symbolList.end())
		{
			Error("Unexpected end of script when parsing property declaration");
			return;
		}
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing property declaration");
			return;
		}

		// Check if first keyword matches a library name
		for (auto libName : m_importList)
		{
			if (libName == m_currentSymbol->text)
			{
				Error("Property name cannot start with an import library name");
				return;
			}
		}

		// Find out which library this property belongs to
		auto propertyLibrary = m_library;
		auto libraryName = CheckLibraryName();
		if (!libraryName.empty())
		{
			propertyLibrary = m_runtime->GetLibraryInternal(libraryName);
			NextSymbol();
		}

		// Parse the property name
		if (!CheckName())
		{
			Error("Property name expected");
			return;
		}

		// Search for multi-part property names
		String name = ParseMultiName({ SymbolType::To });

		if (propertyLibrary->PropertyNameExists(name))
		{
			PreviousSymbol();
			Error("Property is already defined");
			return;
		}

		// Create a PropertyName object for registration
		PropertyName propertyName(scope, readOnly, propertyLibrary->GetName(), name);

		// Register the property name, and check for duplicates
		if (!propertyLibrary->RegisterPropertyName(propertyName, true))
		{
			Error("Error registering property name.  Possible duplicate.");
			return;
		}

		// Set property value
		EmitOpcode(Opcode::Property);
		propertyName.Write(m_writer);

		if (Accept(SymbolType::To))
		{
			// Parse expression
			ParseExpression();
			Expect(SymbolType::NewLine, "Error parsing expression");

			// Set property opcode
			EmitOpcode(Opcode::SetProp);
			EmitId(propertyName.GetId());
			m_idNameMap[propertyName.GetId()] = propertyName.GetName();
		}
		else if (readOnly)
		{
			// A declaration with no assignment is allowed, but not for a readonly property			
			Error("Must assign property an initial value");
			return;
		}
		else
		{
			Expect(SymbolType::NewLine, "Error declaring property");
		}
	}